

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

void __thiscall
nonsugar::detail::parse_flag_short<std::__cxx11::string,int,void>::operator()
          (parse_flag_short<std::__cxx11::string,int,void> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              last,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *arg_it,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          arg_last,shared_ptr<int> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *s_00;
  shared_ptr<int> sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs = *it->_M_current;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  if (it->_M_current + 1 == last._M_current) {
    pbVar1 = arg_it->_M_current;
    arg_it->_M_current = pbVar1 + 1;
    if (pbVar1 + 1 == arg_last._M_current) {
      widen<std::__cxx11::string>(&local_f0,(detail *)"argument required: -",last._M_current);
      std::operator+(&local_d0,&local_f0,__rhs);
      std::__cxx11::string::operator=((string *)err,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      goto LAB_00156132;
    }
    std::__cxx11::string::_M_assign((string *)&local_b0);
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_d0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    it->_M_current = last._M_current + -1;
  }
  sVar2 = std::
          function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()((function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &flg->read);
  if ((void *)local_100._0_8_ == (void *)0x0) {
    widen<std::__cxx11::string>
              (&local_70,(detail *)"invalid argument: -",
               (char *)sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _M_pi);
    std::operator+(&local_50,&local_70,__rhs);
    widen<std::__cxx11::string>(&local_90,(detail *)0x15a583,s_00);
    std::operator+(&local_f0,&local_50,&local_90);
    std::operator+(&local_d0,&local_f0,&local_b0);
    std::__cxx11::string::operator=((string *)err,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)local_100);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
LAB_00156132:
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void operator()(
        NameIterator &it, NameIterator last, Iterator &arg_it, Iterator arg_last,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        auto const name = *it;
        String s;
        if (std::next(it) == last) {
            ++arg_it;
            if (arg_it == arg_last) {
                err = widen<String>("argument required: -") + name;
                return;
            }
            s = *arg_it;
        } else {
            s = String(std::next(it), last);
            it = std::prev(last);
        }
        auto const v = flg.read(s);
        if (!v) {
            err = widen<String>("invalid argument: -") + name + widen<String>(" ") + s;
            return;
        }
        value = v;
    }